

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

void Curl_verboseconnect(Curl_easy *data,connectdata *conn,int sockindex)

{
  char *local_40;
  char *local_38;
  char *local_30;
  int sockindex_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if (((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) == 0) || (sockindex != 1)) {
    if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
       (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
      if (((ulong)conn->bits >> 1 & 1) == 0) {
        if (((ulong)conn->bits & 1) == 0) {
          if (((ulong)conn->bits >> 8 & 1) == 0) {
            local_40 = (conn->host).dispname;
          }
          else {
            local_40 = (conn->conn_to_host).dispname;
          }
          local_38 = local_40;
        }
        else {
          local_38 = (conn->http_proxy).host.dispname;
        }
        local_30 = local_38;
      }
      else {
        local_30 = (conn->socks_proxy).host.dispname;
      }
      Curl_infof(data,"Connected to %s (%s) port %u",local_30,&conn->primary,
                 (ulong)(uint)(conn->primary).remote_port);
    }
  }
  else if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0))
          && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))
          ) {
    Curl_infof(data,"Connected 2nd connection to %s port %u",&conn->secondary,
               (ulong)(uint)(conn->secondary).remote_port);
  }
  if ((conn->handler->protocol & 0xc0000003) != 0) {
    if (conn->alpn == '\x03') {
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
         (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
        Curl_infof(data,"using HTTP/2");
      }
    }
    else if (conn->alpn == '\x1e') {
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
         (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
        Curl_infof(data,"using HTTP/3");
      }
    }
    else if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0))
            && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) {
      Curl_infof(data,"using HTTP/1.x");
    }
  }
  return;
}

Assistant:

void Curl_verboseconnect(struct Curl_easy *data,
                         struct connectdata *conn, int sockindex)
{
  if(data->set.verbose && sockindex == SECONDARYSOCKET)
    infof(data, "Connected 2nd connection to %s port %u",
          conn->secondary.remote_ip, conn->secondary.remote_port);
  else
    infof(data, "Connected to %s (%s) port %u",
          CURL_CONN_HOST_DISPNAME(conn), conn->primary.remote_ip,
          conn->primary.remote_port);
#ifndef CURL_DISABLE_HTTP
    if(conn->handler->protocol & PROTO_FAMILY_HTTP) {
      switch(conn->alpn) {
      case CURL_HTTP_VERSION_3:
        infof(data, "using HTTP/3");
        break;
      case CURL_HTTP_VERSION_2:
        infof(data, "using HTTP/2");
        break;
      default:
        infof(data, "using HTTP/1.x");
        break;
      }
    }
#endif
}